

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseBuilder::deletePass(BaseBuilder *this,Pass *pass)

{
  uint32_t uVar1;
  Error EVar2;
  Pass *pass_local;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar2 = 5;
  }
  else if (pass == (Pass *)0x0) {
    EVar2 = 2;
  }
  else {
    pass_local = pass;
    if (pass->_cb != (BaseBuilder *)0x0) {
      if (pass->_cb != this) {
        return 3;
      }
      uVar1 = ZoneVector<asmjit::v1_14::Pass_*>::indexOf(&this->_passes,&pass_local);
      if (uVar1 == 0xffffffff) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/builder.cpp"
                   ,0x219,"index != Globals::kNotFound");
      }
      pass_local->_cb = (BaseBuilder *)0x0;
      ZoneVector<asmjit::v1_14::Pass_*>::removeAt(&this->_passes,(ulong)uVar1);
    }
    (**pass_local->_vptr_Pass)(pass_local);
    EVar2 = 0;
  }
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseBuilder::deletePass(Pass* pass) noexcept {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(pass == nullptr))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (pass->_cb != nullptr) {
    if (pass->_cb != this)
      return DebugUtils::errored(kErrorInvalidState);

    uint32_t index = _passes.indexOf(pass);
    ASMJIT_ASSERT(index != Globals::kNotFound);

    pass->_cb = nullptr;
    _passes.removeAt(index);
  }

  pass->~Pass();
  return kErrorOk;
}